

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

bool pybind11::array_t<long,_17>::check_(handle h)

{
  _func_bool_PyObject_ptr_PyObject_ptr *p_Var1;
  PyObject *pPVar2;
  bool bVar3;
  npy_api *this;
  PyObject **ppPVar4;
  PyArray_Proxy *pPVar5;
  bool local_3d;
  handle local_28;
  npy_api *local_20;
  npy_api *api;
  handle h_local;
  
  api = (npy_api *)h.m_ptr;
  this = detail::npy_api::get();
  local_20 = this;
  ppPVar4 = handle::ptr((handle *)&api);
  bVar3 = detail::npy_api::PyArray_Check_(this,*ppPVar4);
  local_3d = false;
  if (bVar3) {
    p_Var1 = local_20->PyArray_EquivTypes_;
    ppPVar4 = handle::ptr((handle *)&api);
    pPVar5 = detail::array_proxy(*ppPVar4);
    pPVar2 = pPVar5->descr;
    dtype::of<long>();
    ppPVar4 = handle::ptr(&local_28);
    local_3d = (*p_Var1)(pPVar2,*ppPVar4);
  }
  h_local.m_ptr._7_1_ = local_3d;
  if (bVar3) {
    dtype::~dtype((dtype *)&local_28);
  }
  return (bool)(h_local.m_ptr._7_1_ & 1);
}

Assistant:

static bool check_(handle h) {
        const auto &api = detail::npy_api::get();
        return api.PyArray_Check_(h.ptr())
               && api.PyArray_EquivTypes_(detail::array_proxy(h.ptr())->descr, dtype::of<T>().ptr());
    }